

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InlinePass::MoveInstsBeforeEntryBlock
          (InlinePass *this,
          unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
          *preCallSB,BasicBlock *new_blk_ptr,iterator *call_inst_itr,
          UptrVectorIterator<spvtools::opt::BasicBlock,_false> call_block_itr)

{
  Instruction *this_00;
  uint32_t uVar1;
  undefined8 in_RAX;
  mapped_type *ppIVar2;
  Instruction *inst;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  while (this_00 = *(Instruction **)
                    ((long)&((((call_block_itr.iterator_._M_current._M_current)->_M_t).
                              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                             _M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>
                    + 0x10), this_00 != (call_inst_itr->super_iterator).node_) {
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
              (&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    if ((this_00->opcode_ == OpImage) || (this_00->opcode_ == OpSampledImage)) {
      uVar1 = Instruction::result_id(this_00);
      uStack_38 = CONCAT44(uVar1,(undefined4)uStack_38);
      ppIVar2 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)preCallSB,(key_type *)((long)&uStack_38 + 4));
      *ppIVar2 = this_00;
    }
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
              (&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>,
               &(new_blk_ptr->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_);
  }
  return;
}

Assistant:

void InlinePass::MoveInstsBeforeEntryBlock(
    std::unordered_map<uint32_t, Instruction*>* preCallSB,
    BasicBlock* new_blk_ptr, BasicBlock::iterator call_inst_itr,
    UptrVectorIterator<BasicBlock> call_block_itr) {
  for (auto cii = call_block_itr->begin(); cii != call_inst_itr;
       cii = call_block_itr->begin()) {
    Instruction* inst = &*cii;
    inst->RemoveFromList();
    std::unique_ptr<Instruction> cp_inst(inst);
    // Remember same-block ops for possible regeneration.
    if (IsSameBlockOp(&*cp_inst)) {
      auto* sb_inst_ptr = cp_inst.get();
      (*preCallSB)[cp_inst->result_id()] = sb_inst_ptr;
    }
    new_blk_ptr->AddInstruction(std::move(cp_inst));
  }
}